

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_window_expression.cpp
# Opt level: O1

void __thiscall
duckdb::BoundWindowExpression::Serialize(BoundWindowExpression *this,Serializer *serializer)

{
  type function;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  
  Expression::Serialize(&this->super_Expression,serializer);
  Serializer::WriteProperty<duckdb::LogicalType>
            (serializer,200,"return_type",&(this->super_Expression).return_type);
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"children");
  Serializer::
  WriteValue<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,&this->children);
  (*serializer->_vptr_Serializer[3])(serializer);
  if ((this->super_Expression).super_BaseExpression.type == WINDOW_AGGREGATE) {
    function = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
               ::operator*(&this->aggregate);
    FunctionSerializer::Serialize<duckdb::AggregateFunction>
              (serializer,function,
               (optional_ptr<duckdb::FunctionData,_true>)
               (this->bind_info).
               super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
  }
  (*serializer->_vptr_Serializer[2])(serializer,0xca,"partitions");
  Serializer::
  WriteValue<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,&this->partitions);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xcb,"orders");
  Serializer::WriteValue<duckdb::BoundOrderByNode>(serializer,&this->orders);
  (*serializer->_vptr_Serializer[3])(serializer);
  local_20._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xcc,"filters",&this->filter_expr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20);
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  (*serializer->_vptr_Serializer[2])(serializer,0xcd,"ignore_nulls");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->ignore_nulls);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xce,"start");
  Serializer::WriteValue<duckdb::WindowBoundary>(serializer,this->start);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xcf,"end");
  Serializer::WriteValue<duckdb::WindowBoundary>(serializer,this->end);
  (*serializer->_vptr_Serializer[3])(serializer);
  local_20._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd0,"start_expr",&this->start_expr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20);
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_20._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd1,"end_expr",&this->end_expr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20);
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_20._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd2,"offset_expr",&this->offset_expr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20);
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_20._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd3,"default_expr",&this->default_expr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20);
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  (*serializer->_vptr_Serializer[2])(serializer,0xd4,"exclude_clause");
  Serializer::WriteValue<duckdb::WindowExcludeMode>(serializer,this->exclude_clause);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xd5,"distinct");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->distinct);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xd6,"arg_orders");
  Serializer::WriteValue<duckdb::BoundOrderByNode>(serializer,&this->arg_orders);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void BoundWindowExpression::Serialize(Serializer &serializer) const {
	Expression::Serialize(serializer);
	serializer.WriteProperty(200, "return_type", return_type);
	serializer.WriteProperty(201, "children", children);
	if (type == ExpressionType::WINDOW_AGGREGATE) {
		D_ASSERT(aggregate);
		FunctionSerializer::Serialize(serializer, *aggregate, bind_info.get());
	}
	serializer.WriteProperty(202, "partitions", partitions);
	serializer.WriteProperty(203, "orders", orders);
	serializer.WritePropertyWithDefault(204, "filters", filter_expr, unique_ptr<Expression>());
	serializer.WriteProperty(205, "ignore_nulls", ignore_nulls);
	serializer.WriteProperty(206, "start", start);
	serializer.WriteProperty(207, "end", end);
	serializer.WritePropertyWithDefault(208, "start_expr", start_expr, unique_ptr<Expression>());
	serializer.WritePropertyWithDefault(209, "end_expr", end_expr, unique_ptr<Expression>());
	serializer.WritePropertyWithDefault(210, "offset_expr", offset_expr, unique_ptr<Expression>());
	serializer.WritePropertyWithDefault(211, "default_expr", default_expr, unique_ptr<Expression>());
	serializer.WriteProperty(212, "exclude_clause", exclude_clause);
	serializer.WriteProperty(213, "distinct", distinct);
	serializer.WriteProperty(214, "arg_orders", arg_orders);
}